

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O0

NLW2_SOLReadResultCode mp::Read(FILE *f,int binary,double *v,string *err)

{
  int iVar1;
  char *pcVar2;
  double *in_RCX;
  char *in_RDX;
  int in_ESI;
  FILE *in_RDI;
  NLW2_SOLReadResultCode local_4;
  
  std::__cxx11::string::resize((ulong)in_RCX);
  if (in_ESI == 0) {
    pcVar2 = (char *)std::__cxx11::string::data();
    iVar1 = std::__cxx11::string::size();
    pcVar2 = fgets(pcVar2,iVar1 + -1,in_RDI);
  }
  else {
    pcVar2 = (char *)fread(in_RDX,8,1,in_RDI);
  }
  if (pcVar2 == (char *)0x0) {
    local_4 = NLW2_SOLRead_Early_EOF;
  }
  else {
    if (in_ESI == 0) {
      std::__cxx11::string::data();
      iVar1 = decstring(in_RDX,in_RCX);
      if (iVar1 != 0) {
        return NLW2_SOLRead_Bad_Line;
      }
    }
    local_4 = NLW2_SOLRead_OK;
  }
  return local_4;
}

Assistant:

inline NLW2_SOLReadResultCode Read(
    FILE* f, int binary, double& v, std::string& err) {
  err.resize(512);
  if (binary ? !std::fread((char *)&v, sizeof(double), 1, f)
       : !fgets((char*)err.data(), err.size()-1, f))
    return NLW2_SOLRead_Early_EOF;
  if (!binary && decstring(err.data(), &v))
    return NLW2_SOLRead_Bad_Line;
  return NLW2_SOLRead_OK;
}